

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  vec<2U,_float> *this_00;
  vec<2U,_float> *this_01;
  vec<2U,_float> *pvVar6;
  VectorInfo *pVVar7;
  bool *pbVar8;
  float fVar9;
  float fVar10;
  double right_dist2;
  double left_dist2;
  vec<2U,_float> *v;
  uint i;
  uint end;
  uint begin;
  vec<2U,_float> *right_child;
  vec<2U,_float> *left_child;
  distance_comparison_task_params *pParams;
  void *pData_ptr_local;
  uint64 data_local;
  tree_clusterizer<crnlib::vec<2U,_float>_> *this_local;
  
  this_00 = *pData_ptr;
  this_01 = *(vec<2U,_float> **)((long)pData_ptr + 8);
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  iVar2 = *(int *)((long)pData_ptr + 0x14);
  iVar3 = *(int *)((long)pData_ptr + 0x10);
  uVar4 = *(uint *)((long)pData_ptr + 0x18);
  for (v._4_4_ = *(int *)((long)pData_ptr + 0x10) +
                 (int)(((uint)(*(int *)((long)pData_ptr + 0x14) - *(int *)((long)pData_ptr + 0x10))
                       * data) / (ulong)*(uint *)((long)pData_ptr + 0x18));
      v._4_4_ < (uint)(iVar1 + (int)(((ulong)(uint)(iVar2 - iVar3) * (data + 1)) / (ulong)uVar4));
      v._4_4_ = v._4_4_ + 1) {
    pvVar6 = this->m_vectors;
    pVVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::operator[]
                       (&this->m_vectorsInfo,v._4_4_);
    uVar5 = pVVar7->index;
    fVar9 = vec<2U,_float>::squared_distance(this_00,pvVar6 + uVar5);
    fVar10 = vec<2U,_float>::squared_distance(this_01,pvVar6 + uVar5);
    pbVar8 = vector<bool>::operator[](&this->m_vectorComparison,v._4_4_);
    *pbVar8 = fVar9 < fVar10;
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr)
        {
            distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
            const VectorType& left_child = *pParams->left_child;
            const VectorType& right_child = *pParams->right_child;
            uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
            uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
            for (uint i = begin; i < end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                m_vectorComparison[i] = left_dist2 < right_dist2;
            }
        }